

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp.c
# Opt level: O2

RK_S32 check_cap(vdpp2_params *params)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  
  if (params == (vdpp2_params *)0x0) {
    if (((byte)vdpp2_debug & 4) == 0) {
      return 0;
    }
    _mpp_log_l(4,"vdpp2","found null pointer params\n",0);
    return 0;
  }
  uVar4 = params->src_height_vir;
  if ((uVar4 < params->src_height) || (params->src_width_vir < params->src_width)) {
    if (((byte)vdpp2_debug & 4) == 0) {
      return 0;
    }
    _mpp_log_l(4,"vdpp2","invalid src img_w %d img_h %d img_w_vir %d img_h_vir %d\n",0,
               params->src_width,params->src_height,params->src_width_vir,uVar4);
    return 0;
  }
  iVar5 = 0;
  if (((params->src_fmt != 0) && (params->src_fmt != 5)) &&
     (iVar5 = 1, ((byte)vdpp2_debug & 4) != 0)) {
    _mpp_log_l(4,"vdpp2","vep only support nv12 or nv21\n",0);
    uVar4 = params->src_height_vir;
  }
  if ((((0x800 < uVar4) || (0x780 < params->src_width_vir)) ||
      ((params->src_height < 0x80 || ((params->src_width_vir < 0x80 || (uVar4 < 0x80)))))) ||
     (params->src_width < 0x80)) {
    if (((byte)vdpp2_debug & 4) != 0) {
      _mpp_log_l(4,"vdpp2","vep unsupported src img_w %d img_h %d img_w_vir %d img_h_vir %d\n",0,
                 params->src_width,params->src_height,params->src_width_vir,uVar4);
    }
    iVar5 = iVar5 + 1;
  }
  uVar4 = params->dst_height_vir;
  if (((((0x800 < uVar4) || (uVar2 = params->dst_width_vir, 0x780 < uVar2)) ||
       (params->dst_height < 0x80)) || ((uVar2 < params->dst_width || (uVar4 < params->dst_height)))
      ) || ((uVar2 < 0x80 || ((uVar4 < 0x80 || (params->dst_width < 0x80)))))) {
    if (((byte)vdpp2_debug & 4) != 0) {
      _mpp_log_l(4,"vdpp2","vep unsupported dst img_w %d img_h %d img_w_vir %d img_h_vir %d\n",0,
                 params->dst_width,params->dst_height,params->dst_width_vir,uVar4);
    }
    iVar5 = iVar5 + 1;
  }
  if (((params->src_width_vir & 0xf) != 0) || ((params->dst_width_vir & 0xf) != 0)) {
    if ((((byte)vdpp2_debug & 4) != 0) &&
       (_mpp_log_l(4,"vdpp2","vep only support img_w_i/o_vir 16Byte align\n",0),
       ((byte)vdpp2_debug & 4) != 0)) {
      _mpp_log_l(4,"vdpp2","vep unsupported src img_w_vir %d dst img_w_vir %d\n",0,
                 params->src_width_vir,params->dst_width_vir);
    }
    iVar5 = iVar5 + 1;
  }
  if ((params->src_height_vir & 7) != 0) {
    if ((((byte)vdpp2_debug & 4) != 0) &&
       (_mpp_log_l(4,"vdpp2","vep only support img_h_in_vir 8pix align\n",0),
       ((byte)vdpp2_debug & 4) != 0)) {
      _mpp_log_l(4,"vdpp2","vep unsupported src img_h_vir %d\n",0,params->src_height_vir);
    }
    iVar5 = iVar5 + 1;
  }
  if ((params->dst_height_vir & 1) != 0) {
    if ((((byte)vdpp2_debug & 4) != 0) &&
       (_mpp_log_l(4,"vdpp2","vep only support img_h_out_vir 2pix align\n",0),
       ((byte)vdpp2_debug & 4) != 0)) {
      _mpp_log_l(4,"vdpp2","vep unsupported dst img_h_vir %d\n",0,params->dst_height_vir);
    }
    iVar5 = iVar5 + 1;
  }
  if (((((params->src_width & 1) != 0) || ((params->src_height & 1) != 0)) ||
      ((params->dst_width & 1) != 0)) || ((params->dst_height & 1) != 0)) {
    if ((((byte)vdpp2_debug & 4) != 0) &&
       (_mpp_log_l(4,"vdpp2","vep only support img_w/h_vld 2pix align\n",0),
       ((byte)vdpp2_debug & 4) != 0)) {
      _mpp_log_l(4,"vdpp2","vep unsupported img_w_i %d img_h_i %d img_w_o %d img_h_o %d\n",0,
                 params->src_width,params->src_height,params->dst_width,params->dst_height);
    }
    iVar5 = iVar5 + 1;
  }
  if (params->yuv_out_diff != 0) {
    uVar4 = params->dst_c_height_vir;
    if ((((0x800 < uVar4) || (uVar2 = params->dst_c_width_vir, 0x780 < uVar2)) ||
        ((params->dst_c_height < 0x80 ||
         (((uVar2 < params->dst_c_width || (uVar4 < params->dst_c_height)) || (uVar2 < 0x80)))))) ||
       ((uVar4 < 0x80 || (params->dst_c_width < 0x80)))) {
      if (((byte)vdpp2_debug & 4) != 0) {
        _mpp_log_l(4,"vdpp2","vep unsupported dst_c img_w %d img_h %d img_w_vir %d img_h_vir %d\n",0
                   ,params->dst_c_width,params->dst_c_height,params->dst_c_width_vir,uVar4);
      }
      iVar5 = iVar5 + 1;
      uVar2 = params->dst_c_width_vir;
    }
    if ((uVar2 & 0xf) != 0) {
      if ((((byte)vdpp2_debug & 4) != 0) &&
         (_mpp_log_l(4,"vdpp2","vep only support img_w_c_out_vir 16Byte align\n",0),
         ((byte)vdpp2_debug & 4) != 0)) {
        _mpp_log_l(4,"vdpp2","vep unsupported dst img_w_c_vir %d\n",0,params->dst_c_width_vir);
      }
      iVar5 = iVar5 + 1;
    }
    if ((params->dst_c_height_vir & 1) != 0) {
      if ((((byte)vdpp2_debug & 4) != 0) &&
         (_mpp_log_l(4,"vdpp2","vep only support img_h_c_out_vir 2pix align\n",0),
         ((byte)vdpp2_debug & 4) != 0)) {
        _mpp_log_l(4,"vdpp2","vep unsupported dst img_h_vir %d\n",0,params->dst_c_height_vir);
      }
      iVar5 = iVar5 + 1;
    }
    if (((((params->dst_c_width & 1) != 0) || ((params->dst_c_height & 1) != 0)) &&
        (iVar5 = 1, ((byte)vdpp2_debug & 4) != 0)) &&
       (_mpp_log_l(4,"vdpp2","vep only support img_c_w/h_vld 2pix align\n",0),
       ((byte)vdpp2_debug & 4) != 0)) {
      _mpp_log_l(4,"vdpp2","vep unsupported img_w_o %d img_h_o %d\n",0,params->dst_c_width,
                 params->dst_c_height);
    }
  }
  if ((((0x1000 < params->src_height_vir) || (0x1000 < params->src_width_vir)) ||
      ((params->src_height < 0x80 || (bVar1 = false, params->src_width < 0x80)))) &&
     (bVar1 = true, ((byte)vdpp2_debug & 4) != 0)) {
    _mpp_log_l(4,"vdpp2","dci unsupported src img_w %d img_h %d img_w_vir %d img_h_vir %d\n",0,
               params->src_width,params->src_height,params->src_width_vir,params->src_height_vir);
  }
  if ((params->src_fmt < 0x12) && ((0x2000aU >> (params->src_fmt & 0x1f) & 1) != 0)) {
    if ((params->src_width_vir & 0xf) == 0) goto LAB_00108a06;
    if (((byte)vdpp2_debug & 4) != 0) {
      pcVar3 = "dci Y-10bit input only support img_w_in_vir 16Byte align\n";
LAB_001089ef:
      _mpp_log_l(4,"vdpp2",pcVar3,0);
    }
  }
  else {
    if ((params->src_width_vir & 3) == 0) goto LAB_00108a06;
    if (((byte)vdpp2_debug & 4) != 0) {
      pcVar3 = "dci only support img_w_in_vir 4Byte align\n";
      goto LAB_001089ef;
    }
  }
  bVar1 = true;
LAB_00108a06:
  if ((((byte)vdpp2_debug & 2) != 0) &&
     (_mpp_log_l(4,"vdpp2","vdpp2 src img resolution: w-%d-%d, h-%d-%d\n",0,params->src_width,
                 params->src_width_vir,params->src_height,params->src_height_vir),
     ((byte)vdpp2_debug & 2) != 0)) {
    _mpp_log_l(4,"vdpp2","vdpp2 dst img resolution: w-%d-%d, h-%d-%d\n",0,params->dst_width,
               params->dst_width_vir,params->dst_height,params->dst_height_vir);
  }
  uVar4 = 0;
  if ((iVar5 == 0) && (uVar4 = 1, ((byte)vdpp2_debug & 2) != 0)) {
    _mpp_log_l(4,"vdpp2","vdpp2 support mode: VDPP_CAP_VEP\n",0);
  }
  if (!bVar1) {
    if (((byte)vdpp2_debug & 2) != 0) {
      _mpp_log_l(4,"vdpp2","vdpp2 support mode: VDPP_CAP_HIST\n",0);
    }
    return uVar4 | 2;
  }
  return uVar4;
}

Assistant:

static RK_S32 check_cap(struct vdpp_params *params)
{
    RK_S32 ret_cap = VDPP_CAP_UNSUPPORTED;
    RK_U32 vep_mode_check = 0;

    if (NULL == params) {
        VDPP_DBG(VDPP_DBG_CHECK, "found null pointer params\n");
        return VDPP_CAP_UNSUPPORTED;
    }

    if ((params->src_height < VDPP_MODE_MIN_HEIGHT) ||
        (params->src_width < VDPP_MODE_MIN_WIDTH)) {
        VDPP_DBG(VDPP_DBG_CHECK, "vep src unsupported img_w %d img_h %d\n",
                 params->src_height, params->src_width);
        vep_mode_check++;
    }

    if ((params->dst_height < VDPP_MODE_MIN_HEIGHT) ||
        (params->dst_width < VDPP_MODE_MIN_WIDTH)) {
        VDPP_DBG(VDPP_DBG_CHECK, "vep dst unsupported img_w %d img_h %d\n",
                 params->dst_height, params->dst_width);
        vep_mode_check++;
    }

    if ((params->src_width & 1) || (params->src_height & 1) ||
        (params->dst_width & 1) || (params->dst_height & 1)) {
        VDPP_DBG(VDPP_DBG_CHECK, "vep only support img_w/h_vld 2pix align\n");
        VDPP_DBG(VDPP_DBG_CHECK, "vep unsupported img_w_i %d img_h_i %d img_w_o %d img_h_o %d\n",
                 params->src_width, params->src_height, params->dst_width, params->dst_height);
        vep_mode_check++;
    }

    if (!vep_mode_check) {
        ret_cap |= VDPP_CAP_VEP;
        VDPP_DBG(VDPP_DBG_INT, "vdpp support mode: VDPP_CAP_VEP\n");
    }

    return ret_cap;
}